

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O3

int __thiscall
QtMWidgets::NavigationBar::setMainWidget(NavigationBar *this,QString *title,QWidget *widget)

{
  NavigationBarPrivate *pNVar1;
  Data *pDVar2;
  Data *dd;
  QWidget *pQVar3;
  QString *text;
  int iVar4;
  Type *pTVar5;
  iterator iVar6;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar7;
  QWidget *local_50;
  QString *local_48;
  QSharedPointer<QtMWidgets::NavigationItem> local_40;
  
  local_50 = widget;
  local_48 = title;
  iVar4 = QStackedWidget::addWidget((QWidget *)((this->d).d)->stack);
  pNVar1 = (this->d).d;
  pTVar5 = (Type *)operator_new(0x40);
  (pTVar5->title).d.d = (Data *)0x0;
  (pTVar5->title).d.ptr = (char16_t *)0x0;
  (pTVar5->title).d.size = 0;
  pTVar5->self = (QWidget *)0x0;
  (pTVar5->children).d.d = (Data *)0x0;
  (pTVar5->children).d.ptr = (QSharedPointer<QtMWidgets::NavigationItem> *)0x0;
  (pTVar5->children).d.size = 0;
  pTVar5->parent = (NavigationItem *)0x0;
  local_40.value = pTVar5;
  local_40.d = (Data *)operator_new(0x18);
  *(Type **)(local_40.d + 1) = pTVar5;
  (local_40.d)->destroyer =
       QtSharedPointer::
       ExternalRefCountWithCustomDeleter<QtMWidgets::NavigationItem,_QtSharedPointer::NormalDeleter>
       ::deleter;
  ((local_40.d)->strongref)._q_value.super___atomic_base<int>._M_i = 1;
  ((local_40.d)->weakref)._q_value.super___atomic_base<int>._M_i = 1;
  QtPrivate::QMovableArrayOps<QSharedPointer<QtMWidgets::NavigationItem>>::
  emplace<QSharedPointer<QtMWidgets::NavigationItem>>
            ((QMovableArrayOps<QSharedPointer<QtMWidgets::NavigationItem>> *)&pNVar1->rootItems,
             (pNVar1->rootItems).d.size,&local_40);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(local_40.d);
  iVar6 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::end(&((this->d).d)->rootItems);
  pQVar7 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&((this->d).d)->itemsMap,&local_50);
  pTVar5 = iVar6.i[-1].value;
  pDVar2 = iVar6.i[-1].d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  dd = pQVar7->d;
  pQVar7->d = pDVar2;
  pQVar7->value = pTVar5;
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  iVar6 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::end(&((this->d).d)->rootItems);
  text = local_48;
  QString::operator=(&(iVar6.i[-1].value)->title,local_48);
  pQVar3 = local_50;
  iVar6 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::end(&((this->d).d)->rootItems);
  (iVar6.i[-1].value)->self = pQVar3;
  QStackedWidget::setCurrentIndex((int)((this->d).d)->stack);
  TextLabel::setText(((this->d).d)->title,text);
  return iVar4;
}

Assistant:

int
NavigationBar::setMainWidget( const QString & title,
	QWidget * widget )
{
	const int index = d->stack->addWidget( widget );

	d->rootItems.append(
		QSharedPointer< NavigationItem > ( new NavigationItem ) );
	d->itemsMap[ widget ] = d->rootItems.back();

	d->rootItems.back()->title = title;
	d->rootItems.back()->self = widget;

	d->stack->setCurrentIndex( index );
	d->title->setText( title );

	return index;
}